

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinetic.c
# Opt level: O2

void massagekinetic(Item *q1,Item *q2,Item *q3,Item *q4,int sensused)

{
  Symbol *pSVar1;
  Item *pIVar2;
  Symbol *pSVar3;
  Item *pIVar4;
  int iVar5;
  Item *pIVar6;
  long lVar7;
  Reaction **ppRVar8;
  Rterm *pRVar9;
  Rlist *pRVar10;
  Symbol **ppSVar11;
  List *pLVar12;
  char **ppcVar13;
  char *pcVar14;
  Rterm **ppRVar15;
  Item *pIVar16;
  Item *pIVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  Item **ppIVar23;
  List *pLVar24;
  char buf1 [8192];
  
  pSVar1 = (q2->element).sym;
  if (((pSVar1->subtype & 0x600U) != 0) && ((pSVar1->u).i != 0)) {
    diag("Merging kinetic blocks not implemented",(char *)0x0);
  }
  pSVar1->subtype = pSVar1->subtype | 0x400;
  numlist = numlist + 1;
  (pSVar1->u).i = numlist;
  sprintf(buf,"\n/* _kinetic_ %s %s */\n#ifndef INSIDE_NMODL\n#define INSIDE_NMODL\n#endif\n",
          ((q2->element).sym)->name,suffix);
  linsertstr(procfunc,buf);
  sprintf(buf,
          "\ntemplate <coreneuron::scopmath::enabled_code code_to_enable = coreneuron::scopmath::enabled_code::all>\nstruct %s%s {\n  int operator()(SparseObj* _so, double* _rhs, _threadargsproto_) const;\n};\ntemplate <coreneuron::scopmath::enabled_code code_to_enable>\nint"
          ,((q2->element).sym)->name,suffix);
  replacstr(q1,buf);
  sprintf(buf,"%s%s<code_to_enable>::operator()",((q2->element).sym)->name,suffix);
  replacstr(q2,buf);
  pIVar6 = insertstr(q3,"()\n");
  if (vectorize != 0) {
    kin_vect1(q1,q2,q4);
    vectorize_substitute(pIVar6,"(SparseObj* _so, double* _rhs, _threadargsproto_) const\n");
  }
  pIVar6 = insertstr(q3,"{_reset=0;\n");
  builtin_strncpy(buf,"{int _reset=0;\n",0x10);
  vectorize_substitute(pIVar6,buf);
  pIVar6 = q3->next;
  if ((pIVar6->itemtype == 0x143) && (iVar5 = strcmp((pIVar6->element).str,"double"), iVar5 == 0)) {
    do {
      do {
        pIVar6 = pIVar6->next;
      } while (pIVar6->itemtype != 0x143);
      pcVar14 = (pIVar6->element).str;
    } while (((*pcVar14 != ';') || (pcVar14[1] != '\n')) || (pcVar14[2] != '\0'));
    pIVar6 = pIVar6->next;
  }
  insertstr(pIVar6,"double b_flux, f_flux, _term; int _i;\n");
  for (lVar7 = 0x41; lVar7 != 0x7b; lVar7 = lVar7 + 1) {
    pLVar12 = symlist[lVar7];
    pIVar16 = pLVar12;
    while (pIVar16 = pIVar16->next, pIVar16 != pLVar12) {
      pIVar2 = (pIVar16->element).itm;
      if (((pIVar2->itemtype == 0x13e) && (((ulong)pIVar2->element & 0x10) != 0)) &&
         (*(int *)&pIVar2[1].next != 0)) {
        *(undefined4 *)&pIVar2[1].next = 0;
      }
    }
  }
  ppRVar8 = &conslist;
  while (ppRVar8 = &((Reaction *)ppRVar8)->reactnext->reactnext,
        (Reaction *)ppRVar8 != (Reaction *)0x0) {
    pRVar9 = (Rterm *)((Reaction *)ppRVar8)->rterm;
    while (pRVar9 = pRVar9->rnext, pRVar9 != (Rterm *)0x0) {
      if (pRVar9->isstate != 0) {
        pRVar9->sym->used = -1;
      }
    }
  }
  ppRVar8 = &reactlist;
  while (ppRVar8 = &((Reaction *)ppRVar8)->reactnext->reactnext,
        (Reaction *)ppRVar8 != (Reaction *)0x0) {
    pRVar9 = (Rterm *)((Reaction *)ppRVar8)->rterm;
    while (pRVar9 = pRVar9->rnext, pRVar9 != (Rterm *)0x0) {
      if (pRVar9->isstate != 0) {
        pRVar9->sym->used = -1;
      }
    }
    ppRVar15 = ((Reaction *)ppRVar8)->rterm + 1;
    while (ppRVar15 = &(*ppRVar15)->rnext, ppRVar15 != (Rterm **)0x0) {
      if (*(short *)((long)ppRVar15 + 0x1c) != 0) {
        *(undefined4 *)((long)ppRVar15[1] + 0x30) = 0xffffffff;
      }
    }
  }
  ppRVar8 = &conslist;
  uVar20 = 0;
  while (ppRVar8 = &((Reaction *)ppRVar8)->reactnext->reactnext,
        (Reaction *)ppRVar8 != (Reaction *)0x0) {
    pRVar9 = (Rterm *)((Reaction *)ppRVar8)->rterm;
    do {
      pRVar9 = pRVar9->rnext;
      if (pRVar9 == (Rterm *)0x0) {
        diag("Failed to diagonalize the Kinetic matrix",(char *)0x0);
      }
      pSVar3 = pRVar9->sym;
    } while ((pSVar3->used != -1) || ((pSVar3->subtype & 0x20) != 0));
    pSVar3->varnum = uVar20;
    uVar20 = uVar20 + 1;
    pSVar3->used = uVar20;
  }
  uVar19 = (ulong)uVar20;
  uVar21 = uVar20;
  for (lVar7 = 0x41; lVar7 != 0x7b; lVar7 = lVar7 + 1) {
    pLVar12 = symlist[lVar7];
    pIVar16 = pLVar12;
    while (pIVar16 = pIVar16->next, pIVar16 != pLVar12) {
      pIVar2 = (pIVar16->element).itm;
      if (((pIVar2->itemtype == 0x13e) &&
          (pIVar4 = (pIVar2->element).itm, ((ulong)pIVar4 & 0x10) != 0)) &&
         (*(int *)&pIVar2[1].next == -1)) {
        *(uint *)(pIVar2 + 2) = uVar21;
        uVar18 = (int)uVar19 + 1;
        uVar19 = (ulong)uVar18;
        *(uint *)&pIVar2[1].next = uVar18;
        if (((ulong)pIVar4 & 0x20) == 0) {
          uVar21 = uVar21 + 1;
        }
        else {
          uVar21 = uVar21 + *(int *)&pIVar2[1].prev;
        }
      }
    }
  }
  if (uVar21 != 0) {
    pSVar1->used = uVar21;
    sprintf(buf,"_slist%d",(ulong)(uint)numlist);
    add_global_var("int",buf,0,1,uVar21,1);
    sprintf(buf,"_dlist%d",(ulong)(uint)numlist);
    add_global_var("int",buf,0,1,uVar21,1);
    insertstr(q4,"  } return _reset;\n");
    movelist(q1,q4,procfunc);
    pRVar10 = (Rlist *)emalloc(0x50);
    pRVar10->reaction = reactlist;
    reactlist = (Reaction *)0x0;
    pRVar10->sens_parm = sens_parm;
    uVar21 = (uint)(uVar19 << 3);
    ppSVar11 = (Symbol **)emalloc(uVar21);
    pRVar10->symorder = ppSVar11;
    pRVar10->slist_decl = 0;
    for (lVar7 = 0x41; lVar7 != 0x7b; lVar7 = lVar7 + 1) {
      pLVar12 = symlist[lVar7];
      pLVar24 = pLVar12;
      while (pLVar24 = pLVar24->next, pLVar24 != pLVar12) {
        pSVar3 = (pLVar24->element).sym;
        if (((pSVar3->type == 0x13e) && ((pSVar3->subtype & 0x10) != 0)) &&
           (((long)pSVar3->used != 0 &&
            (pRVar10->symorder[(long)pSVar3->used + -1] = pSVar3, sensused != 0)))) {
          add_sens_statelist(pSVar3);
        }
        pLVar12 = symlist[lVar7];
      }
    }
    pRVar10->nsym = (int)uVar19;
    pRVar10->ncons = uVar20;
    pRVar10->position = pIVar6;
    pRVar10->endbrace = q4->prev;
    if (sensused != 0) {
      sensmassage(0x10a,q2,numlist);
    }
    pRVar10->sym = pSVar1;
    pRVar10->rlistnext = rlist;
    uVar22 = 0;
    rlist = pRVar10;
    pRVar10 = (Rlist *)emalloc(0x50);
    pRVar10->reaction = conslist;
    conslist = (Reaction *)0x0;
    pRVar10->sym = pSVar1;
    pRVar10->rlistnext = clist;
    clist = pRVar10;
    ppcVar13 = (char **)emalloc(uVar21);
    rlist->capacity = ppcVar13;
    if ((int)uVar19 < 1) {
      uVar19 = uVar22;
    }
    for (; uVar19 != uVar22; uVar22 = uVar22 + 1) {
      rlist->capacity[uVar22] = "";
    }
    if (compartlist != (List *)0x0) {
      pIVar6 = compartlist;
      while (pIVar6 = pIVar6->next, pIVar6 != compartlist) {
        pIVar16 = (pIVar6->element).itm;
        pIVar2 = (pIVar6->next->element).itm;
        pIVar6 = pIVar6->next->next;
        pIVar4 = (pIVar6->element).itm;
        pIVar17 = pIVar2;
        while (pIVar17 = pIVar17->next, pIVar17 != pIVar4) {
          pcVar14 = qconcat(pIVar16,pIVar2->prev);
          sprintf(buf1,"(%s)",pcVar14);
          pcVar14 = stralloc(buf1,(char *)0x0);
          rlist->capacity[(long)((pIVar17->element).sym)->used + -1] = pcVar14;
        }
      }
      freelist(&compartlist);
    }
    for (lVar7 = 0x41; lVar7 != 0x7b; lVar7 = lVar7 + 1) {
      pLVar12 = symlist[lVar7];
      pIVar6 = pLVar12;
      while (pIVar6 = pIVar6->next, pIVar6 != pLVar12) {
        pIVar16 = (pIVar6->element).itm;
        if (((pIVar16->itemtype == 0x13e) && (((ulong)pIVar16->element & 0x10) != 0)) &&
           (*(int *)&pIVar16[1].next != 0)) {
          *(undefined4 *)&pIVar16[1].next = 0;
        }
      }
    }
    cvode_sbegin = q3;
    cvode_send = q4;
    kin_items_ = newlist();
    ppIVar23 = &cvode_sbegin;
    while (pIVar6 = *ppIVar23, pIVar6 != cvode_send->next) {
      lappenditem(kin_items_,pIVar6);
      ppIVar23 = &pIVar6->next;
    }
    return;
  }
  diag("KINETIC contains no reactions",(char *)0x0);
}

Assistant:

void massagekinetic(q1, q2, q3, q4, sensused) /*KINETIC NAME stmtlist '}'*/
	Item *q1, *q2, *q3,*q4;
	int sensused;
{
	int count = 0, i, order, ncons;
	Item *q, *qs, *afterbrace;
	Item* qv;
	Symbol *s, *fun;
	Reaction *r1;
	Rterm *rt;
	Rlist *r;
	
	fun = SYM(q2);
	if ((fun->subtype & (DERF|KINF)) && fun->u.i) {
		diag("Merging kinetic blocks not implemented", (char *)0);
	}
	fun->subtype |= KINF;
	numlist++;
	fun->u.i = numlist;
	
#if 0
	Sprintf(buf, "static int %s();\n", SYM(q2)->name);
	Linsertstr(procfunc, buf);
	replacstr(q1, "\nstatic int");
#else
	Sprintf(buf,
	  "\n"
	  "/* _kinetic_ %s %s */\n"
	  "#ifndef INSIDE_NMODL\n"
	  "#define INSIDE_NMODL\n"
	  "#endif\n"
	  , SYM(q2)->name, suffix);
	Linsertstr(procfunc, buf);
	Sprintf(buf, "\ntemplate <coreneuron::scopmath::enabled_code code_to_enable = coreneuron::scopmath::enabled_code::all>\nstruct %s%s {\n  int operator()(SparseObj* _so, double* _rhs, _threadargsproto_) const;\n};\ntemplate <coreneuron::scopmath::enabled_code code_to_enable>\nint", SYM(q2)->name, suffix);
	replacstr(q1, buf);
	Sprintf(buf, "%s%s<code_to_enable>::operator()", SYM(q2)->name, suffix);
	replacstr(q2, buf);
#endif
	qv = insertstr(q3, "()\n");
#if VECTORIZE
if (vectorize) {
	kin_vect1(q1, q2, q4);
	vectorize_substitute(qv, "(SparseObj* _so, double* _rhs, _threadargsproto_) const\n");
}
#endif
	qv = insertstr(q3, "{_reset=0;\n");
#if VECTORIZE
Sprintf(buf, "{int _reset=0;\n");
	vectorize_substitute(qv, buf);
#endif
	afterbrace = q3->next;
#if Glass
 	/* Make sure that if the next statement was LOCAL xxx, we skip
 	past it to do any of the other declarations. DRB */
 	if(afterbrace->itemtype==STRING &&
 		!strcmp(afterbrace->element.str,"double")){
 		for(afterbrace = afterbrace->next ;
 			afterbrace->itemtype!=STRING ||
 			strcmp(afterbrace->element.str,";\n") ;
 			afterbrace=afterbrace->next);
 		if(afterbrace->itemtype==STRING &&
 		!strcmp(afterbrace->element.str,";\n"))
 			afterbrace=afterbrace->next;
 		}

#endif
	qv = insertstr(afterbrace, "double b_flux, f_flux, _term; int _i;\n");
#if 0 && VECTORIZE
	vectorize_substitute(qv, "int _i;\n");
#endif
	/* also after these declarations will go initilization statements */
	
	order = 0;
	/* the varnum and order of the states is such that diagonals of
	conservation equations must be first.  This is done by setting
	s->used=-1 for all states and then numbering first with respect
	to the conslist and then the remaining that are still -1
	*/
	/* mark only the isstate states */
	SYMITER(NAME) {
		if ((s->subtype & STAT) && s->used) {
			s->used = 0;
		}
	}
	for (r1 = conslist; r1; r1 = r1->reactnext) {
		for (rt = r1->rterm[0]; rt; rt = rt->rnext) {
			if (rt->isstate) {
				rt->sym->used = -1;
			}
		}
	}
	for (r1 = reactlist; r1; r1 = r1->reactnext) {
		for (rt = r1->rterm[0]; rt; rt = rt->rnext) {
			if (rt->isstate) {
				rt->sym->used = -1;
			}
		}
		for (rt = r1->rterm[1]; rt; rt = rt->rnext) {
			if (rt->isstate) {
				rt->sym->used = -1;
			}
		}
	}

	/* diagonals of the conservation relations are first */
	for (r1 = conslist; r1; r1 = r1->reactnext) {
		for (rt = r1->rterm[0]; rt; rt = rt->rnext) {
		   if ((rt->sym->used == -1) && !(rt->sym->subtype & ARRAY)) {
				rt->sym->varnum = count++;
				rt->sym->used = ++order; /*first is 1*/
				break;
		   }
		}
		if (!rt) {
		   diag("Failed to diagonalize the Kinetic matrix", (char *)0);
		}
	}
	ncons = count; /* can't use array as conservation diagonal */
	/* others can be in any order */
	SYMITER(NAME) {
		if ((s->subtype & STAT) && s->used == -1) {
			s->varnum = count;
			s->used = ++order; /* count and order  distinct states */
			if (s->subtype & ARRAY) { int dim = s->araydim;
				count += dim;
			}else{
				count++;
			}
		}
	}
	if (count == 0) {
		diag("KINETIC contains no reactions", (char *)0);
	}
	fun->used = count;

	Sprintf(buf, "_slist%d", numlist);
	add_global_var("int", buf, 0, 1, count, 1);
	Sprintf(buf, "_dlist%d", numlist);
	add_global_var("int", buf, 0, 1, count, 1);

	insertstr(q4, "  } return _reset;\n");
	movelist(q1, q4, procfunc);

	r = (Rlist *)emalloc(sizeof(Rlist));
	r->reaction = reactlist;
	reactlist = (Reaction *)0;
	r->sens_parm = sens_parm;
	r->symorder = (Symbol **)emalloc((unsigned)order*sizeof(Symbol *));
	r->slist_decl = 0;
	/*the reason that we can't just keep this info in s->varnum is that
	more than one block can have the same state with a different varnum */
	SYMITER(NAME) {
		if ((s->subtype & STAT) && s->used) {
			r->symorder[s->used - 1] = s;
			if (sensused) {
				add_sens_statelist(s);
			}
		}
	}
	r->nsym = order;
	r->ncons = ncons;
	r->position = afterbrace;
	r->endbrace = q4->prev;	/* needed for Dstate with COMPARTMENT */
	if (sensused) {
		/* fun now is the interface and fun->used is all the states */
		sensmassage(DERIVATIVE, q2, numlist);
		/* this sets sens_parm to 0 */
	}
	r->sym = fun;
	r->rlistnext = rlist;
	rlist = r;
	r = (Rlist *)emalloc(sizeof(Rlist));
	r->reaction = conslist;
	conslist = (Reaction *)0;
	r->sym = fun;
	r->rlistnext = clist;
	clist = r;

	/* handle compartlist if any */
	rlist->capacity = (char **)emalloc((unsigned)order*sizeof(char *));
	for (i=0; i<order; i++) {
		rlist->capacity[i] = "";
	}
	if (compartlist) {
		char buf1[NRN_BUFSIZE];
		Item *q, *qexp, *qb, *qend, *q1;
		ITERATE(q, compartlist) {
			qexp = ITM(q); q = q->next;
			qb = ITM(q); q = q->next;
			qend = ITM(q);
			for (q1 = qb->next; q1 != qend; q1 = q1->next) {
				Sprintf(buf1, "(%s)", qconcat(qexp, qb->prev));
rlist->capacity[SYM(q1)->used - 1] = stralloc(buf1, (char *)0);
			}
		}
		freelist(&compartlist);
	}

	SYMITER(NAME) {
		if ((s->subtype & STAT) && s->used) {
			s->used = 0;
		}
	}
#if CVODE
	cvode_sbegin = q3;
	cvode_send = q4;
	kin_items_ = newlist();
	for (q = cvode_sbegin; q != cvode_send->next; q = q->next) {
		lappenditem(kin_items_, q);
	}
#endif
}